

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprinter.cpp
# Opt level: O2

void __thiscall QPrinterPrivate::setPreviewMode(QPrinterPrivate *this,bool enable)

{
  QPrinter *this_00;
  QPreviewPaintEngine *this_01;
  undefined7 in_register_00000031;
  
  this_00 = this->q_ptr;
  if ((int)CONCAT71(in_register_00000031,enable) != 0) {
    this_01 = this->previewEngine;
    if (this_01 == (QPreviewPaintEngine *)0x0) {
      this_01 = (QPreviewPaintEngine *)operator_new(0x28);
      QPreviewPaintEngine::QPreviewPaintEngine(this_01);
      this->previewEngine = this_01;
    }
    this->field_0x44 = this->field_0x44 & 0xfc | this->field_0x44 * '\x02' & 2U;
    this->realPrintEngine = this->printEngine;
    this->realPaintEngine = this->paintEngine;
    QPrinter::setEngines(this_00,&this_01->super_QPrintEngine,&this_01->super_QPaintEngine);
    QPreviewPaintEngine::setProxyEngines
              (this->previewEngine,this->realPrintEngine,this->realPaintEngine);
    return;
  }
  QPrinter::setEngines(this_00,this->realPrintEngine,this->realPaintEngine);
  this->field_0x44 = this->field_0x44 & 0xfe | (byte)this->field_0x44 >> 1 & 1;
  return;
}

Assistant:

void QPrinterPrivate::setPreviewMode(bool enable)
{
    Q_Q(QPrinter);
    if (enable) {
        if (!previewEngine)
            previewEngine = new QPreviewPaintEngine;
        had_default_engines = use_default_engine;
        use_default_engine = false;
        realPrintEngine = printEngine;
        realPaintEngine = paintEngine;
        q->setEngines(previewEngine, previewEngine);
        previewEngine->setProxyEngines(realPrintEngine, realPaintEngine);
    } else {
        q->setEngines(realPrintEngine, realPaintEngine);
        use_default_engine = had_default_engines;
    }
}